

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O0

void __thiscall QSslCertificate::clear(QSslCertificate *this)

{
  bool bVar1;
  QSslCertificatePrivate *o;
  QSslCertificatePrivate *in_RDI;
  QSslCertificate *in_stack_ffffffffffffffe8;
  QSslCertificatePrivate *this_00;
  
  this_00 = in_RDI;
  bVar1 = isNull(in_stack_ffffffffffffffe8);
  if (!bVar1) {
    o = (QSslCertificatePrivate *)operator_new(0x10);
    QSslCertificatePrivate::QSslCertificatePrivate(this_00);
    QExplicitlySharedDataPointer<QSslCertificatePrivate>::operator=
              ((QExplicitlySharedDataPointer<QSslCertificatePrivate> *)in_RDI,o);
  }
  return;
}

Assistant:

void QSslCertificate::clear()
{
    if (isNull())
        return;
    d = new QSslCertificatePrivate;
}